

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::CropLayerParams::InternalSwap(CropLayerParams *this,CropLayerParams *other)

{
  CropLayerParams *other_local;
  CropLayerParams *this_local;
  
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap(&this->offset_,&other->offset_);
  std::swap<CoreML::Specification::BorderAmounts*>(&this->cropamounts_,&other->cropamounts_);
  std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  return;
}

Assistant:

void CropLayerParams::InternalSwap(CropLayerParams* other) {
  offset_.InternalSwap(&other->offset_);
  std::swap(cropamounts_, other->cropamounts_);
  std::swap(_cached_size_, other->_cached_size_);
}